

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1541.c
# Opt level: O2

void * run_thread(void *ptr)

{
  time_t tVar1;
  time_t tVar2;
  undefined8 uVar3;
  int iVar4;
  
  tVar1 = time((time_t *)0x0);
  iVar4 = 0;
  while( true ) {
    tVar2 = time((time_t *)0x0);
    if (tVar1 + 7 <= tVar2) break;
    uVar3 = curl_easy_init();
    curl_easy_setopt(uVar3,0x2712,*ptr);
    curl_easy_setopt(uVar3,0x29,0);
    curl_easy_setopt(uVar3,0x2774,*(undefined8 *)((long)ptr + 8));
    curl_easy_setopt(uVar3,0x4e2b,write_db);
    curl_easy_perform(uVar3);
    curl_easy_cleanup(uVar3);
    curl_mfprintf(_stderr,"Thread %d transfer %d\n",*(undefined4 *)((long)ptr + 0x10),iVar4);
    iVar4 = iVar4 + 1;
  }
  return (void *)0x0;
}

Assistant:

static void *run_thread(void *ptr)
{
  struct initurl *u = (struct initurl *)ptr;
  int i;
  time_t end = time(NULL) + RUN_FOR_SECONDS;

  for(i = 0; time(NULL) < end; i++) {
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, u->url);
    curl_easy_setopt(curl, CURLOPT_VERBOSE, 0L);
    curl_easy_setopt(curl, CURLOPT_SHARE, u->share);
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, write_db);
    curl_easy_perform(curl); /* ignores error */
    curl_easy_cleanup(curl);
    fprintf(stderr, "Thread %d transfer %d\n", u->threadno, i);
  }

  return NULL;
}